

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_main_func.cpp
# Opt level: O2

void __thiscall menu::menuExit(menu *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Program finished the work.",&local_31);
  log::addLog((log *)this,Success,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  this->m_Exit = true;
  return;
}

Assistant:

void menu::menuExit()
{
    m_Logger(Op::Success, "Program finished the work.");
    m_Exit = true;
}